

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O0

VectorXd __thiscall RadarMeasurement::InitializeState(RadarMeasurement *this,int n)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  int in_EDX;
  DenseIndex extraout_RDX;
  undefined4 in_register_00000034;
  long lVar4;
  double dVar5;
  double dVar6;
  VectorXd VVar7;
  double phi;
  double rho;
  Scalar local_28;
  undefined1 local_1d;
  long lStack_18;
  int n_local;
  RadarMeasurement *this_local;
  VectorXd *x;
  
  lVar4 = CONCAT44(in_register_00000034,n);
  local_1d = 0;
  lStack_18 = lVar4;
  this_local = this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,(long)in_EDX);
  local_28 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::fill
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,&local_28);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)(lVar4 + 0x18),0
                     );
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)(lVar4 + 0x18),1
                     );
  dVar6 = *pdVar2;
  dVar5 = cos(dVar6);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,0);
  *pSVar3 = dVar1 * dVar5;
  dVar6 = sin(dVar6);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,1);
  *pSVar3 = dVar1 * dVar6;
  VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

VectorXd RadarMeasurement::InitializeState(int n) const {

    VectorXd x(n);
    // initialize the state vector
    x.fill(1.0);
    double rho = measurements_[0];
    double phi = measurements_[1];
    x(0) = rho * cos(phi);
    x(1) = rho * sin(phi);
    //x(0) = (fabs(rho)<0.001) ? 0.01 : rho * cos(phi);
    //x(1) = (fabs(rho)<0.001) ? 0.01 : rho * sin(phi);
    // TODO: redo equations here:
    // v: rho dot is actually a predo equations here:rojection of v to vector rho.  
    // psi: the is angle between vy and v
    //x(2) = measurements_[2];
    //x(3) = phi; 
    return x;
}